

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Ladder_Web.cpp
# Opt level: O1

int __thiscall RenX_Ladder_WebPlugin::init(RenX_Ladder_WebPlugin *this,EVP_PKEY_CTX *ctx)

{
  undefined1 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  uint uVar4;
  const_iterator cVar5;
  size_t sVar6;
  FILE *__stream;
  undefined1 auVar7 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string *local_50;
  string *local_48;
  string *local_40;
  string *local_38;
  
  puVar1 = &this->field_0x38;
  auVar7 = Jupiter::Config::get(puVar1,0xe,"HeaderFilename",0x1b,"RenX.Ladder.Web.Header.html");
  paVar2 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,auVar7._8_8_,auVar7._0_8_ + auVar7._8_8_);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->web_header_filename,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  auVar7 = Jupiter::Config::get(puVar1,0xe,"FooterFilename",0x1b,"RenX.Ladder.Web.Footer.html");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,auVar7._8_8_,auVar7._0_8_ + auVar7._8_8_);
  local_50 = &this->web_footer_filename;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  auVar7 = Jupiter::Config::get(puVar1,0xf,"ProfileFilename",0x1c,"RenX.Ladder.Web.Profile.html");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,auVar7._8_8_,auVar7._0_8_ + auVar7._8_8_);
  local_48 = &this->web_profile_filename;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (local_48,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  auVar7 = Jupiter::Config::get
                     (puVar1,0x19,"LadderTableHeaderFilename",0x28,
                      "RenX.Ladder.Web.Ladder.Table.Header.html");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,auVar7._8_8_,auVar7._0_8_ + auVar7._8_8_);
  local_40 = &this->web_ladder_table_header_filename;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (local_40,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  auVar7 = Jupiter::Config::get
                     (puVar1,0x19,"LadderTableFooterFilename",0x28,
                      "RenX.Ladder.Web.Ladder.Table.Footer.html");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,auVar7._8_8_,auVar7._0_8_ + auVar7._8_8_);
  local_38 = &this->web_ladder_table_footer_filename;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (local_38,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)0xe;
  local_70._M_string_length = 0x10f138;
  cVar5 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void,void>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->field_0x60,
                     (basic_string_view<char,_std::char_traits<char>_> *)&local_70);
  if (cVar5.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    sVar6 = 0x32;
  }
  else {
    sVar6 = Jupiter_strtoull_s(*(undefined8 *)
                                ((long)cVar5.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                       ._M_cur + 0x28),
                               *(undefined8 *)
                                ((long)cVar5.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                       ._M_cur + 0x30),0);
  }
  this->entries_per_page = sVar6;
  local_70._M_dataplus._M_p = (pointer)0x13;
  local_70._M_string_length = 0x10f147;
  cVar5 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void,void>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->field_0x60,
                     (basic_string_view<char,_std::char_traits<char>_> *)&local_70);
  if (cVar5.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    sVar6 = 3;
  }
  else {
    sVar6 = Jupiter_strtoull_s(*(undefined8 *)
                                ((long)cVar5.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                       ._M_cur + 0x28),
                               *(undefined8 *)
                                ((long)cVar5.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                       ._M_cur + 0x30),0);
  }
  this->min_search_name_length = sVar6;
  auVar7 = Jupiter::Config::get
                     (puVar1,0xd,"EntryTableRow",0x1b6,
                      "<tr><td class=\"data-col-a\">{RANK}</td><td class=\"data-col-b\"><a href=\"profile?id={STEAM}&database={OBJECT}\">{NAME}</a></td><td class=\"data-col-a\">{SCORE}</td><td class=\"data-col-b\">{SPM}</td><td class=\"data-col-a\">{GAMES}</td><td class=\"data-col-b\">{WINS}</td><td class=\"data-col-a\">{LOSSES}</td><td class=\"data-col-b\">{WLR}</td><td class=\"data-col-a\">{KILLS}</td><td class=\"data-col-b\">{DEATHS}</td><td class=\"data-col-a\">{KDR}</td></tr>"
                     );
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&this->entry_table_row,0,(this->entry_table_row)._M_string_length,auVar7._8_8_,
             auVar7._0_8_);
  auVar7 = Jupiter::Config::get
                     (puVar1,0x14,"EntryProfilePrevious",0xde,
                      "<form class=\"profile-previous\"><input type=\"hidden\" name=\"database\" value=\"{OBJECT}\"/><input type=\"hidden\" name=\"id\" value=\"{WEAPON}\"/><input class=\"profile-previous-submit\" type=\"submit\" value=\"&#x21A9 Previous\" /></form>"
                     );
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&this->entry_profile_previous,0,(this->entry_profile_previous)._M_string_length,
             auVar7._8_8_,auVar7._0_8_);
  auVar7 = Jupiter::Config::get
                     (puVar1,0x10,"EntryProfileNext",0xd2,
                      "<form class=\"profile-next\"><input type=\"hidden\" name=\"database\" value=\"{OBJECT}\"/><input type=\"hidden\" name=\"id\" value=\"{VSTEAM}\"/><input class=\"profile-next-submit\" type=\"submit\" value=\"Next &#x21AA\" /></form>"
                     );
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&this->entry_profile_next,0,(this->entry_profile_next)._M_string_length,auVar7._8_8_,
             auVar7._0_8_);
  RenX::sanitizeTags((string *)&this->entry_table_row);
  RenX::sanitizeTags((string *)&this->entry_profile_previous);
  RenX::sanitizeTags((string *)&this->entry_profile_next);
  (this->header)._M_string_length = 0;
  *(this->header)._M_dataplus._M_p = '\0';
  (this->footer)._M_string_length = 0;
  *(this->footer)._M_dataplus._M_p = '\0';
  (this->entry_profile)._M_string_length = 0;
  *(this->entry_profile)._M_dataplus._M_p = '\0';
  (this->ladder_table_header)._M_string_length = 0;
  *(this->ladder_table_header)._M_dataplus._M_p = '\0';
  (this->ladder_table_footer)._M_string_length = 0;
  __stream = (FILE *)(this->ladder_table_footer)._M_dataplus._M_p;
  *(undefined1 *)&__stream->_flags = 0;
  if ((this->web_header_filename)._M_string_length != 0) {
    __stream = fopen((this->web_header_filename)._M_dataplus._M_p,"rb");
    if (__stream != (FILE *)0x0) {
      iVar3 = fgetc(__stream);
      if (iVar3 != -1) {
        do {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (&this->header,(char)iVar3);
          iVar3 = fgetc(__stream);
        } while (iVar3 != -1);
      }
      uVar4 = fclose(__stream);
      __stream = (FILE *)(ulong)uVar4;
    }
  }
  if ((this->web_footer_filename)._M_string_length != 0) {
    __stream = fopen((local_50->_M_dataplus)._M_p,"rb");
    if (__stream != (FILE *)0x0) {
      iVar3 = fgetc(__stream);
      if (iVar3 != -1) {
        do {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (&this->footer,(char)iVar3);
          iVar3 = fgetc(__stream);
        } while (iVar3 != -1);
      }
      uVar4 = fclose(__stream);
      __stream = (FILE *)(ulong)uVar4;
    }
  }
  if ((this->web_profile_filename)._M_string_length != 0) {
    __stream = fopen((local_48->_M_dataplus)._M_p,"rb");
    if (__stream != (FILE *)0x0) {
      while( true ) {
        iVar3 = fgetc(__stream);
        if (iVar3 == -1) break;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&this->entry_profile,(char)iVar3);
      }
      RenX::sanitizeTags((string *)&this->entry_profile);
      uVar4 = fclose(__stream);
      __stream = (FILE *)(ulong)uVar4;
    }
  }
  if ((this->web_ladder_table_header_filename)._M_string_length != 0) {
    __stream = fopen((local_40->_M_dataplus)._M_p,"rb");
    if (__stream != (FILE *)0x0) {
      iVar3 = fgetc(__stream);
      if (iVar3 != -1) {
        do {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (&this->ladder_table_header,(char)iVar3);
          iVar3 = fgetc(__stream);
        } while (iVar3 != -1);
      }
      uVar4 = fclose(__stream);
      __stream = (FILE *)(ulong)uVar4;
    }
  }
  if ((this->web_ladder_table_footer_filename)._M_string_length != 0) {
    __stream = fopen((local_38->_M_dataplus)._M_p,"rb");
    if (__stream != (FILE *)0x0) {
      iVar3 = fgetc(__stream);
      if (iVar3 != -1) {
        do {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (&this->ladder_table_footer,(char)iVar3);
          iVar3 = fgetc(__stream);
        } while (iVar3 != -1);
      }
      uVar4 = fclose(__stream);
      __stream = (FILE *)(ulong)uVar4;
    }
  }
  return (int)__stream;
}

Assistant:

void RenX_Ladder_WebPlugin::init() {
	FILE *file;
	int chr;

	RenX_Ladder_WebPlugin::web_header_filename = static_cast<std::string>(this->config.get("HeaderFilename"sv, "RenX.Ladder.Web.Header.html"sv));
	RenX_Ladder_WebPlugin::web_footer_filename = static_cast<std::string>(this->config.get("FooterFilename"sv, "RenX.Ladder.Web.Footer.html"sv));
	RenX_Ladder_WebPlugin::web_profile_filename = static_cast<std::string>(this->config.get("ProfileFilename"sv, "RenX.Ladder.Web.Profile.html"sv));
	RenX_Ladder_WebPlugin::web_ladder_table_header_filename = static_cast<std::string>(this->config.get("LadderTableHeaderFilename"sv, "RenX.Ladder.Web.Ladder.Table.Header.html"sv));
	RenX_Ladder_WebPlugin::web_ladder_table_footer_filename = static_cast<std::string>(this->config.get("LadderTableFooterFilename"sv, "RenX.Ladder.Web.Ladder.Table.Footer.html"sv));
	RenX_Ladder_WebPlugin::entries_per_page = this->config.get<size_t>("EntriesPerPage"sv, 50);
	RenX_Ladder_WebPlugin::min_search_name_length = this->config.get<size_t>("MinSearchNameLength"sv, 3);

	RenX_Ladder_WebPlugin::entry_table_row = this->config.get("EntryTableRow"sv, R"html(<tr><td class="data-col-a">{RANK}</td><td class="data-col-b"><a href="profile?id={STEAM}&database={OBJECT}">{NAME}</a></td><td class="data-col-a">{SCORE}</td><td class="data-col-b">{SPM}</td><td class="data-col-a">{GAMES}</td><td class="data-col-b">{WINS}</td><td class="data-col-a">{LOSSES}</td><td class="data-col-b">{WLR}</td><td class="data-col-a">{KILLS}</td><td class="data-col-b">{DEATHS}</td><td class="data-col-a">{KDR}</td></tr>)html"sv);
	RenX_Ladder_WebPlugin::entry_profile_previous = this->config.get("EntryProfilePrevious"sv, R"html(<form class="profile-previous"><input type="hidden" name="database" value="{OBJECT}"/><input type="hidden" name="id" value="{WEAPON}"/><input class="profile-previous-submit" type="submit" value="&#x21A9 Previous" /></form>)html"sv);
	RenX_Ladder_WebPlugin::entry_profile_next = this->config.get("EntryProfileNext"sv, R"html(<form class="profile-next"><input type="hidden" name="database" value="{OBJECT}"/><input type="hidden" name="id" value="{VSTEAM}"/><input class="profile-next-submit" type="submit" value="Next &#x21AA" /></form>)html"sv);

	RenX::sanitizeTags(RenX_Ladder_WebPlugin::entry_table_row);
	RenX::sanitizeTags(RenX_Ladder_WebPlugin::entry_profile_previous);
	RenX::sanitizeTags(RenX_Ladder_WebPlugin::entry_profile_next);

	RenX_Ladder_WebPlugin::header.clear();
	RenX_Ladder_WebPlugin::footer.clear();
	RenX_Ladder_WebPlugin::entry_profile.erase();
	RenX_Ladder_WebPlugin::ladder_table_header.erase();
	RenX_Ladder_WebPlugin::ladder_table_footer.erase();

	/** Load header */
	if (!RenX_Ladder_WebPlugin::web_header_filename.empty()) {
		file = fopen(RenX_Ladder_WebPlugin::web_header_filename.c_str(), "rb");
		if (file != nullptr) {
			while ((chr = fgetc(file)) != EOF)
				RenX_Ladder_WebPlugin::header += chr;
			fclose(file);
		}
	}

	/** Load footer */
	if (!RenX_Ladder_WebPlugin::web_footer_filename.empty()) {
		file = fopen(RenX_Ladder_WebPlugin::web_footer_filename.c_str(), "rb");
		if (file != nullptr) {
			while ((chr = fgetc(file)) != EOF)
				RenX_Ladder_WebPlugin::footer += chr;
			fclose(file);
		}
	}

	/** Load profile */
	if (!RenX_Ladder_WebPlugin::web_profile_filename.empty()) {
		file = fopen(RenX_Ladder_WebPlugin::web_profile_filename.c_str(), "rb");
		if (file != nullptr) {
			while ((chr = fgetc(file)) != EOF)
				RenX_Ladder_WebPlugin::entry_profile += chr;
			RenX::sanitizeTags(RenX_Ladder_WebPlugin::entry_profile);
			fclose(file);
		}
	}

	/** Load table header */
	if (!RenX_Ladder_WebPlugin::web_ladder_table_header_filename.empty()) {
		file = fopen(RenX_Ladder_WebPlugin::web_ladder_table_header_filename.c_str(), "rb");
		if (file != nullptr) {
			while ((chr = fgetc(file)) != EOF)
				RenX_Ladder_WebPlugin::ladder_table_header += chr;
			fclose(file);
		}
	}

	/** Load table footer */
	if (!RenX_Ladder_WebPlugin::web_ladder_table_footer_filename.empty()) {
		file = fopen(RenX_Ladder_WebPlugin::web_ladder_table_footer_filename.c_str(), "rb");
		if (file != nullptr) {
			while ((chr = fgetc(file)) != EOF)
				RenX_Ladder_WebPlugin::ladder_table_footer += chr;
			fclose(file);
		}
	}
}